

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaItemListGrow(xmlSchemaItemListPtr list,int initialSize)

{
  int iVar1;
  void **ppvVar2;
  int newSize;
  void **tmp;
  int initialSize_local;
  xmlSchemaItemListPtr list_local;
  
  tmp._4_4_ = initialSize;
  if (initialSize < 1) {
    tmp._4_4_ = 1;
  }
  iVar1 = xmlGrowCapacity(list->sizeItems,8,tmp._4_4_,1000000000);
  if (iVar1 < 0) {
    list_local._4_4_ = -1;
  }
  else {
    ppvVar2 = (void **)(*xmlRealloc)(list->items,(long)iVar1 << 3);
    if (ppvVar2 == (void **)0x0) {
      list_local._4_4_ = -1;
    }
    else {
      list->items = ppvVar2;
      list->sizeItems = iVar1;
      list_local._4_4_ = 0;
    }
  }
  return list_local._4_4_;
}

Assistant:

static int
xmlSchemaItemListGrow(xmlSchemaItemListPtr list, int initialSize)
{
    void **tmp;
    int newSize;

    if (initialSize <= 0)
        initialSize = 1;
    newSize = xmlGrowCapacity(list->sizeItems, sizeof(tmp[0]),
                              initialSize, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(list->items, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);

    list->items = tmp;
    list->sizeItems = newSize;
    return(0);
}